

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<112,Blob<256>>
               (hashfunc<Blob<256>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool result;
  Blob<256> h;
  keytype k;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  bool in_stack_0000009b;
  bool in_stack_0000009c;
  bool in_stack_0000009d;
  bool in_stack_0000009e;
  bool in_stack_0000009f;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_000000a0;
  undefined1 local_64 [4];
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffffa0;
  Blob<112> *in_stack_ffffffffffffffa8;
  uint8_t in_stack_ffffffffffffffb7;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  pfHash in_stack_ffffffffffffffc0;
  Blob<112> local_36;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x70,pcVar4,(ulong)in_ESI);
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)0x1972f7);
  Blob<112>::Blob(&local_36);
  memset(&local_36,0,0xe);
  if ((local_d & 1) != 0) {
    Blob<256>::Blob((Blob<256> *)local_64);
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&local_36,0xe,0,local_64);
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back
              ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)CONCAT44(in_ESI,in_EDX),
               (value_type *)CONCAT44(in_ECX,in_R8D));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<112>,Blob<256>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
             (bool)in_stack_ffffffffffffffb7,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  sVar3 = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar1 = TestHashList<Blob<256>>
                    (in_stack_000000a0,in_stack_0000009f,in_stack_0000009e,in_stack_0000009d,
                     in_stack_0000009c,in_stack_0000009b);
  printf("\n");
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::~vector
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)CONCAT44(in_ESI,in_EDX));
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}